

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QRect>::reallocateAndGrow
          (QArrayDataPointer<QRect> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QRect> *old)

{
  QRect *pQVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  long lVar7;
  QRect *pQVar8;
  QRect *pQVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  QArrayDataPointer<QRect> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QRect> *)0x0 && where == GrowsAtEnd) &&
       (pQVar2 = &this->d->super_QArrayData, pQVar2 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar10 = QArrayData::reallocateUnaligned
                        (pQVar2,this->ptr,0x10,
                         n + this->size +
                         ((long)((long)this->ptr -
                                ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4),
                         Grow);
    this->d = (Data *)auVar10._0_8_;
    this->ptr = (QRect *)auVar10._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar7 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QRect> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        pQVar8 = this->ptr;
        pQVar9 = pQVar8 + lVar7;
        if ((lVar7 != 0) && (0 < lVar7)) {
          do {
            RVar4.m_i = (pQVar8->y1).m_i;
            RVar5.m_i = (pQVar8->x2).m_i;
            RVar6.m_i = (pQVar8->y2).m_i;
            pQVar1 = local_38.ptr + local_38.size;
            pQVar1->x1 = (Representation)(pQVar8->x1).m_i;
            pQVar1->y1 = (Representation)RVar4.m_i;
            pQVar1->x2 = (Representation)RVar5.m_i;
            pQVar1->y2 = (Representation)RVar6.m_i;
            pQVar8 = pQVar8 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar8 < pQVar9);
        }
      }
      else {
        pQVar8 = this->ptr;
        pQVar9 = pQVar8 + lVar7;
        if ((lVar7 != 0) && (0 < lVar7)) {
          do {
            RVar4.m_i = (pQVar8->y1).m_i;
            RVar5.m_i = (pQVar8->x2).m_i;
            RVar6.m_i = (pQVar8->y2).m_i;
            pQVar1 = local_38.ptr + local_38.size;
            pQVar1->x1 = (Representation)(pQVar8->x1).m_i;
            pQVar1->y1 = (Representation)RVar4.m_i;
            pQVar1->x2 = (Representation)RVar5.m_i;
            pQVar1->y2 = (Representation)RVar6.m_i;
            pQVar8 = pQVar8 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar8 < pQVar9);
        }
      }
    }
    pQVar2 = &this->d->super_QArrayData;
    pQVar8 = this->ptr;
    *(undefined4 *)&this->d = local_38.d._0_4_;
    *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
    *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
    *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
    qVar3 = this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar2;
    local_38.ptr = pQVar8;
    local_38.size = qVar3;
    if (old != (QArrayDataPointer<QRect> *)0x0) {
      local_38.d = old->d;
      old->d = (Data *)pQVar2;
      local_38.ptr = old->ptr;
      old->ptr = pQVar8;
      local_38.size = old->size;
      old->size = qVar3;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }